

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O1

void __thiscall
duckdb::ArrowTypeExtension::ArrowTypeExtension
          (ArrowTypeExtension *this,ArrowExtensionMetadata *extension_metadata,
          unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *type)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ArrowTypeExtensionData *pAVar1;
  pointer this_01;
  ArrowTypeExtensionData *__tmp;
  undefined1 local_41;
  ArrowTypeExtensionData *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  LogicalType local_30;
  
  this->populate_arrow_schema = (populate_arrow_schema_t)0x0;
  this->get_type = (get_type_t)0x0;
  ArrowExtensionMetadata::ArrowExtensionMetadata(&this->extension_metadata,extension_metadata);
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
                      (type);
  ArrowType::GetDuckType(&local_30,this_01,false);
  local_40 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ArrowTypeExtensionData,std::allocator<duckdb::ArrowTypeExtensionData>,duckdb::LogicalType>
            (&local_38,&local_40,(allocator<duckdb::ArrowTypeExtensionData> *)&local_41,&local_30);
  pAVar1 = local_40;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pAVar1;
  this_00 = (this->type_extension).internal.
            super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_38._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  LogicalType::~LogicalType(&local_30);
  return;
}

Assistant:

ArrowTypeExtension::ArrowTypeExtension(ArrowExtensionMetadata &extension_metadata, unique_ptr<ArrowType> type)
    : extension_metadata(extension_metadata) {
	type_extension = make_shared_ptr<ArrowTypeExtensionData>(type->GetDuckType());
}